

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O2

int op_fetch_headers(OggOpusFile *_of,OpusHead *_head,OpusTags *_tags,ogg_uint32_t **_serialnos,
                    int *_nserialnos,int *_cserialnos,ogg_page *_og)

{
  ogg_stream_state *poVar1;
  int iVar2;
  int iVar3;
  ogg_uint32_t oVar4;
  undefined4 uVar5;
  int iVar6;
  opus_int64 oVar7;
  ogg_uint32_t *poVar8;
  long lVar9;
  ogg_page og;
  uchar *local_80;
  size_t local_78;
  ogg_page local_50;
  
  if (_og == (ogg_page *)0x0) {
    lVar9 = _of->offset;
    if (0x7ffffffffffefffe < lVar9) {
      lVar9 = 0x7ffffffffffeffff;
    }
    _og = &local_50;
    oVar7 = op_get_next_page(_of,_og,lVar9 + 0x10000);
    if (oVar7 < 0) {
      return -0x84;
    }
  }
  _of->ready_state = 2;
  if (_serialnos != (ogg_uint32_t **)0x0) {
    *_nserialnos = 0;
  }
  poVar1 = &_of->os;
  do {
    iVar3 = ogg_page_bos(_og);
    if (iVar3 == 0) {
      if (_of->ready_state == 3) {
        lVar9 = (_of->os).serialno;
        iVar3 = ogg_page_serialno(_og);
        if (lVar9 != iVar3) goto LAB_00107907;
        while( true ) {
          ogg_stream_pagein(poVar1,_og);
LAB_00107907:
          iVar6 = ogg_stream_packetout(poVar1,&local_80);
          iVar3 = -0x85;
          if (iVar6 != 0) break;
          while( true ) {
            lVar9 = _of->offset;
            if (0x7ffffffffffefffe < lVar9) {
              lVar9 = 0x7ffffffffffeffff;
            }
            oVar7 = op_get_next_page(_of,_og,lVar9 + 0x10000);
            if (oVar7 < 0) goto LAB_00107961;
            lVar9 = (_of->os).serialno;
            iVar3 = ogg_page_serialno(_og);
            if (lVar9 == iVar3) break;
            iVar3 = ogg_page_bos(_og);
            if (iVar3 != 0) goto LAB_00107961;
          }
        }
        if ((iVar6 != -1) && (iVar3 = opus_tags_parse(_tags,local_80,local_78), -1 < iVar3)) {
          iVar3 = ogg_stream_packetout(poVar1,&local_80);
          if ((iVar3 == 0) && (_og->header[_og->header_len + -1] != 0xff)) {
            return 0;
          }
          opus_tags_clear(_tags);
LAB_00107961:
          iVar3 = -0x85;
        }
      }
      else {
        iVar3 = -0x84;
      }
      goto LAB_0010796d;
    }
    if (_serialnos != (ogg_uint32_t **)0x0) {
      poVar8 = *_serialnos;
      iVar3 = *_nserialnos;
      oVar4 = ogg_page_serialno(_og);
      iVar3 = op_lookup_serialno(oVar4,poVar8,iVar3);
      if (iVar3 != 0) goto LAB_00107961;
      oVar4 = ogg_page_serialno(_og);
      poVar8 = *_serialnos;
      iVar2 = *_nserialnos;
      iVar6 = *_cserialnos;
      if (iVar6 <= iVar2) {
        if (0xfffffff < iVar6) {
          iVar3 = -0x81;
          goto LAB_0010796d;
        }
        poVar8 = (ogg_uint32_t *)realloc(poVar8,(long)iVar6 * 8 + 4);
        iVar3 = -0x81;
        if (poVar8 == (ogg_uint32_t *)0x0) goto LAB_0010796d;
        iVar6 = iVar6 * 2 + 1;
      }
      poVar8[iVar2] = oVar4;
      *_serialnos = poVar8;
      *_nserialnos = iVar2 + 1;
      *_cserialnos = iVar6;
    }
    if (_of->ready_state < 3) {
      uVar5 = ogg_page_serialno(_og);
      ogg_stream_reset_serialno(poVar1,uVar5);
      ogg_stream_pagein(poVar1,_og);
      iVar3 = ogg_stream_packetout(poVar1,&local_80);
      if (0 < iVar3) {
        iVar3 = opus_head_parse(_head,local_80,local_78);
        if (iVar3 < 0) {
          if (iVar3 != -0x84) goto LAB_0010796d;
        }
        else {
          _of->ready_state = 3;
        }
      }
    }
    lVar9 = _of->offset;
    if (0x7ffffffffffefffe < lVar9) {
      lVar9 = 0x7ffffffffffeffff;
    }
    oVar7 = op_get_next_page(_of,_og,lVar9 + 0x10000);
  } while (-1 < oVar7);
  iVar3 = (_of->ready_state < 3) - 0x85;
LAB_0010796d:
  _of->ready_state = 2;
  return iVar3;
}

Assistant:

static int op_fetch_headers(OggOpusFile *_of,OpusHead *_head,
 OpusTags *_tags,ogg_uint32_t **_serialnos,int *_nserialnos,
 int *_cserialnos,ogg_page *_og){
  ogg_page og;
  int      ret;
  if(!_og){
    /*No need to clamp the boundary offset against _of->end, as all errors
       become OP_ENOTFORMAT.*/
    if(OP_UNLIKELY(op_get_next_page(_of,&og,
     OP_ADV_OFFSET(_of->offset,OP_CHUNK_SIZE))<0)){
      return OP_ENOTFORMAT;
    }
    _og=&og;
  }
  _of->ready_state=OP_OPENED;
  ret=op_fetch_headers_impl(_of,_head,_tags,_serialnos,_nserialnos,
   _cserialnos,_og);
  /*Revert back from OP_STREAMSET to OP_OPENED on failure, to prevent
     double-free of the tags in an unseekable stream.*/
  if(OP_UNLIKELY(ret<0))_of->ready_state=OP_OPENED;
  return ret;
}